

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<512ul>const&>::operator==
          (ExprLhs<const_std::bitset<512UL>_&> *this,bitset<512UL> *rhs)

{
  StringRef op;
  bool comparisonResult;
  bitset<512UL> *in_RSI;
  BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> *in_RDI;
  bitset<512UL> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<std::bitset<512ul>,std::bitset<512ul>>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = (char *)(in_RSI->super__Base_bitset<8UL>)._M_w[0];
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }